

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

int SimpleString::MemCmp(void *s1,void *s2,size_t n)

{
  size_t sVar1;
  uchar *p2;
  uchar *p1;
  
  sVar1 = 0;
  while( true ) {
    if (n == sVar1) {
      return 0;
    }
    if (*(byte *)((long)s1 + sVar1) != *(byte *)((long)s2 + sVar1)) break;
    sVar1 = sVar1 + 1;
  }
  return (uint)*(byte *)((long)s1 + sVar1) - (uint)*(byte *)((long)s2 + sVar1);
}

Assistant:

int SimpleString::MemCmp(const void* s1, const void *s2, size_t n)
{
    const unsigned char* p1 = (const unsigned char*) s1;
    const unsigned char* p2 = (const unsigned char*) s2;

    while (n--)
        if (*p1 != *p2) {
            return *p1 - *p2;
        } else {
            ++p1;
            ++p2;
        }
    return 0;
}